

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O0

_Bool cert_expr_valid(char *expression,char **error_msg,ptrlen *error_loc)

{
  ExprNode *en_00;
  ptrlen expr;
  ExprNode *en;
  ptrlen *error_loc_local;
  char **error_msg_local;
  char *expression_local;
  
  expr = ptrlen_from_asciz(expression);
  en_00 = parse(expr,error_msg,error_loc);
  if (en_00 != (ExprNode *)0x0) {
    exprnode_free(en_00);
  }
  return en_00 != (ExprNode *)0x0;
}

Assistant:

bool cert_expr_valid(const char *expression,
                     char **error_msg, ptrlen *error_loc)
{
    ExprNode *en = parse(ptrlen_from_asciz(expression), error_msg, error_loc);
    if (en) {
        exprnode_free(en);
        return true;
    } else {
        return false;
    }
}